

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,3ul>>>::
initialize<tinyusdz::Animatable<std::array<float,3ul>>>
          (optional<tinyusdz::Animatable<std::array<float,3ul>>> *this,
          Animatable<std::array<float,_3UL>_> *value)

{
  undefined8 uVar1;
  
  if (*this != (optional<tinyusdz::Animatable<std::array<float,3ul>>>)0x1) {
    uVar1 = *(undefined8 *)(value->_value)._M_elems;
    *(undefined8 *)(this + 0xe) = *(undefined8 *)((long)(value->_value)._M_elems + 6);
    *(undefined8 *)(this + 8) = uVar1;
    *(pointer *)(this + 0x18) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x20) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x28) =
         (value->_ts)._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (value->_ts)._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this[0x30] = (optional<tinyusdz::Animatable<std::array<float,3ul>>>)(value->_ts)._dirty;
    *this = (optional<tinyusdz::Animatable<std::array<float,3ul>>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float, 3>>>::initialize(V &&) [T = tinyusdz::Animatable<std::array<float, 3>>, V = tinyusdz::Animatable<std::array<float, 3>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }